

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_slice<char,false,5>
          (immutable *this,ref<immutable::rrb<char,_false,_5>_> *rrb,uint32_t from,uint32_t to)

{
  ref<immutable::rrb<char,_false,_5>_> local_20;
  ref<immutable::rrb<char,_false,_5>_> local_18;
  
  local_20 = (ref<immutable::rrb<char,_false,_5>_>)rrb->ptr;
  if (local_20.ptr != (rrb<char,_false,_5> *)0x0) {
    (local_20.ptr)->_ref_count = (local_20.ptr)->_ref_count + 1;
  }
  rrb_details::rrb_drop_right<char,false,5>((rrb_details *)&local_18,&local_20,to);
  rrb_details::rrb_drop_left<char,false,5>((rrb_details *)this,&local_18,from);
  ref<immutable::rrb<char,_false,_5>_>::~ref(&local_18);
  ref<immutable::rrb<char,_false,_5>_>::~ref(&local_20);
  return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_slice(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t from, uint32_t to)
    {
    using namespace rrb_details;
    return rrb_drop_left(rrb_drop_right(rrb, to), from);
    }